

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Chase(Task *__return_storage_ptr__,TaskDatabase *tasks)

{
  TaskDatabase *pTVar1;
  mapped_type *pmVar2;
  key_type local_11b8 [2];
  Task local_11b0;
  Task local_e38;
  undefined1 local_ac0 [8];
  Task chaseHeading;
  Task chasePosition;
  Task chaseSight;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  TaskDatabase *local_18;
  TaskDatabase *tasks_local;
  Task *chase;
  
  local_19 = 0;
  local_18 = tasks;
  tasks_local = (TaskDatabase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"chase",&local_41);
  Task::Task(__return_storage_ptr__,&local_40,Abstract);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  __return_storage_ptr__->identifier = Chase;
  create_ChaseSight();
  create_ChaseLastKnownPosition();
  create_ChaseLastKnownHeading();
  pTVar1 = local_18;
  Task::Task(&local_e38,
             (Task *)&chasePosition.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_end_of_storage);
  TaskDatabase::addTask(pTVar1,ChaseSight,&local_e38);
  Task::~Task(&local_e38);
  pTVar1 = local_18;
  Task::Task(&local_11b0,
             (Task *)&chaseHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_end_of_storage);
  TaskDatabase::addTask(pTVar1,ChaseLastKnownPosition,&local_11b0);
  Task::~Task(&local_11b0);
  local_11b8[1] = 2;
  pmVar2 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&local_18->abstractTaskImplementations,local_11b8 + 1);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back
            (pmVar2,(value_type *)
                    &chasePosition.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_end_of_storage);
  local_11b8[0] = Chase;
  pmVar2 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&local_18->abstractTaskImplementations,local_11b8);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back
            (pmVar2,(value_type *)
                    &chaseHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_end_of_storage);
  local_19 = 1;
  Task::~Task((Task *)local_ac0);
  Task::~Task((Task *)&chaseHeading.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_end_of_storage);
  Task::~Task((Task *)&chasePosition.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_end_of_storage);
  if ((local_19 & 1) == 0) {
    Task::~Task(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Task create_Chase(TaskDatabase& tasks)
	{
		Task chase {"chase", TaskType::Abstract};
		chase.identifier = TaskIdentifier::Chase;

		auto chaseSight = create_ChaseSight();
		auto chasePosition = create_ChaseLastKnownPosition();
		auto chaseHeading = create_ChaseLastKnownHeading();

		tasks.addTask(TaskIdentifier::ChaseSight, chaseSight);
		tasks.addTask(TaskIdentifier::ChaseLastKnownPosition, chasePosition);
		//tasks.addTask(TaskIdentifier::ChaseLastKnownHeading, chaseHeading);

		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseSight);
		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chasePosition);
		//tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseHeading);

		return chase;		
	}